

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZSolutionMatrix.cpp
# Opt level: O2

TPZBaseMatrix * __thiscall
TPZSolutionMatrix::operator_cast_to_TPZBaseMatrix_(TPZSolutionMatrix *this)

{
  if (this->fBaseMatrix != (TPZBaseMatrix *)0x0) {
    return this->fBaseMatrix;
  }
  std::operator<<((ostream *)&std::cerr,
                  "TPZBaseMatrix &TPZSolutionMatrix::operator TPZBaseMatrix &()");
  std::operator<<((ostream *)&std::cerr," trying to access undefined matrix\n");
  std::operator<<((ostream *)&std::cerr,"Aborting...");
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/TPZSolutionMatrix.cpp"
             ,0x8f);
}

Assistant:

TPZSolutionMatrix::operator TPZBaseMatrix &(){
  if(!fBaseMatrix){
    PZError<<__PRETTY_FUNCTION__;
    PZError<<" trying to access undefined matrix\n";
    PZError<<"Aborting...";
    DebugStop();
  }
  return *fBaseMatrix;
}